

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgProgramExecutor.cpp
# Opt level: O3

VaryingStorage * __thiscall
rsg::VaryingStore::getStorage(VaryingStore *this,VariableType *type,char *name)

{
  int iVar1;
  int iVar2;
  mapped_type *ppVVar3;
  mapped_type this_00;
  allocator<char> local_51;
  key_type local_50;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,name,&local_51);
  ppVVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rsg::VaryingStorage_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rsg::VaryingStorage_*>_>_>
            ::operator[](&this->m_values,&local_50);
  this_00 = *ppVVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (this_00 == (mapped_type)0x0) {
    this_00 = (mapped_type)operator_new(0x18);
    iVar1 = this->m_numVertices;
    iVar2 = VariableType::getScalarSize(type);
    std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::vector
              ((vector<rsg::Scalar,_std::allocator<rsg::Scalar>_> *)this_00,(long)(iVar2 * iVar1),
               (allocator_type *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,name,&local_51);
    ppVVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rsg::VaryingStorage_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rsg::VaryingStorage_*>_>_>
              ::operator[](&this->m_values,&local_50);
    *ppVVar3 = this_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return this_00;
}

Assistant:

VaryingStorage* VaryingStore::getStorage (const VariableType& type, const char* name)
{
	VaryingStorage* storage = m_values[name];

	if (!storage)
	{
		storage = new VaryingStorage(type, m_numVertices);
		m_values[name] = storage;
	}

	return storage;
}